

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O3

matrix<unsigned_int,_521UL> *
trng::operator*(matrix<unsigned_int,_521UL> *__return_storage_ptr__,matrix<unsigned_int,_521UL> *a,
               matrix<unsigned_int,_521UL> *b)

{
  long lVar1;
  pointer puVar2;
  ulong uVar3;
  pointer puVar4;
  pointer __s;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_type j0;
  ulong uVar9;
  ulong uVar10;
  pointer puVar11;
  pointer puVar12;
  size_type i;
  pointer puVar13;
  pointer puVar14;
  pointer puVar15;
  size_type j_end;
  ulong uVar16;
  value_type_conflict4 *__val;
  int iVar17;
  bool bVar18;
  pointer local_60;
  
  __s = (pointer)operator_new(0x109144);
  (__return_storage_ptr__->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = __s;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = __s + 0x42451;
  memset(__s,0,0x109144);
  lVar5 = 0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = __s + 0x42451;
  puVar2 = (a->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar14 = (b->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar9 = 0;
  local_60 = __s;
  do {
    uVar16 = 0x1e9;
    if (uVar9 < 0x1e9) {
      uVar16 = uVar9;
    }
    lVar7 = -0x109144;
    do {
      if (uVar9 < uVar16 + 0x20) {
        memset((void *)((long)local_60 + (long)&__DT_RELA[0x2d9].r_info + lVar7 + 4),0,
               (uVar16 & 0xffffffff) * 4 + lVar5 * -0x80 + 0x80);
      }
      lVar7 = lVar7 + 0x824;
    } while (lVar7 != 0);
    uVar6 = 0;
    puVar11 = puVar2;
    puVar15 = puVar14;
    do {
      uVar10 = 0x1e9;
      if (uVar6 < 0x1e9) {
        uVar10 = uVar6;
      }
      lVar7 = 0;
      uVar3 = uVar9;
      puVar4 = puVar15;
      puVar12 = puVar11;
      do {
        for (; uVar3 < uVar16 + 0x20; uVar3 = uVar3 + 1) {
          iVar17 = 0;
          if (uVar6 < uVar10 + 0x20) {
            lVar8 = 0;
            iVar17 = 0;
            puVar13 = puVar4;
            do {
              iVar17 = iVar17 + *puVar13 * *(pointer)((long)puVar12 + lVar8 * 4);
              lVar1 = uVar6 + lVar8;
              lVar8 = lVar8 + 1;
              puVar13 = puVar13 + 0x209;
            } while (lVar1 + 1U < uVar10 + 0x20);
          }
          __s[lVar7 * 0x209 + uVar3] = __s[lVar7 * 0x209 + uVar3] + iVar17;
          puVar4 = (pointer)((long)puVar4 + 4);
        }
        lVar7 = lVar7 + 1;
        puVar12 = (pointer)((long)puVar12 + 0x824);
        uVar3 = uVar9;
        puVar4 = puVar15;
      } while (lVar7 != 0x209);
      puVar11 = puVar11 + 0x20;
      puVar15 = puVar15 + 0x4120;
      bVar18 = uVar6 < 0x1e9;
      uVar6 = uVar6 + 0x20;
    } while (bVar18);
    uVar9 = uVar9 + 0x20;
    lVar5 = lVar5 + 1;
    local_60 = local_60 + 0x20;
    puVar14 = puVar14 + 0x20;
  } while (lVar5 != 0x11);
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }